

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ribbon_artist.cpp
# Opt level: O3

void __thiscall polyscope::RibbonArtist::draw(RibbonArtist *this)

{
  bool bVar1;
  float fVar2;
  element_type *peVar3;
  ShaderProgram *p;
  undefined1 in_ZMM1 [64];
  undefined1 auVar4 [64];
  vec3 vVar6;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  undefined1 auVar5 [60];
  
  auVar5 = in_ZMM1._4_60_;
  if ((this->enabled).value == true) {
    p = (this->program).
        super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (p == (ShaderProgram *)0x0) {
      createProgram(this);
      p = (this->program).
          super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
    Structure::setTransformUniforms(this->parentStructure,p);
    vVar6 = view::getCameraWorldPosition();
    auVar4._0_4_ = vVar6.field_2;
    auVar4._4_60_ = auVar5;
    peVar3 = (this->program).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              (vVar6._0_8_,auVar4._0_8_,local_40,"u_ribbonWidth","");
    bVar1 = (this->ribbonWidth).value.relativeFlag;
    fVar2 = (this->ribbonWidth).value.value;
    (*peVar3->_vptr_ShaderProgram[6])
              ((double)(float)((uint)(bVar1 & 1) * (int)(float)((double)fVar2 * state::lengthScale)
                              + (uint)!(bool)(bVar1 & 1) * (int)fVar2),peVar3,local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0]);
    }
    peVar3 = (this->program).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_60[0] = local_50;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"u_depthOffset","");
    (*peVar3->_vptr_ShaderProgram[6])(0x3f1a36e2eb1c432d,peVar3,(string *)local_60);
    if (local_60[0] != local_50) {
      operator_delete(local_60[0]);
    }
    (**(code **)(*render::engine + 0x50))(render::engine,2);
    (**(code **)(*render::engine + 0x58))(render::engine,0);
    (*((this->program).
       super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_ShaderProgram[0x1e])();
    (**(code **)(*render::engine + 0x50))(render::engine,0);
    (**(code **)(*render::engine + 0x58))(render::engine,0);
  }
  return;
}

Assistant:

void RibbonArtist::draw() {

  if (!enabled.get()) {
    return;
  }

  if (!program) {
    createProgram();
  }

  // Set uniforms
  parentStructure.setTransformUniforms(*program);

  glm::vec3 eyePos = view::getCameraWorldPosition();

  program->setUniform("u_ribbonWidth", getWidth());
  program->setUniform("u_depthOffset", 1e-4);

  // Draw
  render::engine->setDepthMode(DepthMode::LEqualReadOnly);
  render::engine->setBlendMode(BlendMode::Over);

  program->draw();

  render::engine->setDepthMode();
  render::engine->setBlendMode();
}